

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_preinit(ma_dr_wav *pWav,ma_dr_wav_read_proc onRead,ma_dr_wav_seek_proc onSeek,
                           void *pReadSeekUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ma_allocation_callbacks *in_R8;
  ma_allocation_callbacks local_50;
  ma_allocation_callbacks *local_30;
  long local_28;
  long local_20;
  long local_18;
  long *local_10;
  ma_bool32 local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_4 = 0;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RDI,0,400);
    *local_10 = local_18;
    local_10[2] = local_20;
    local_10[3] = local_28;
    ma_dr_wav_copy_allocation_callbacks_or_defaults(&local_50,local_30);
    local_10[4] = (long)local_50.pUserData;
    local_10[5] = (long)local_50.onMalloc;
    local_10[6] = (long)local_50.onRealloc;
    local_10[7] = (long)local_50.onFree;
    if ((local_10[7] == 0) || ((local_10[5] == 0 && (local_10[6] == 0)))) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit(ma_dr_wav* pWav, ma_dr_wav_read_proc onRead, ma_dr_wav_seek_proc onSeek, void* pReadSeekUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onRead == NULL || onSeek == NULL) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onRead    = onRead;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pReadSeekUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    return MA_TRUE;
}